

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  TestResult *this_00;
  GTestColor color;
  bool bVar1;
  char *fmt;
  TimeInMillis local_38;
  string local_30;
  
  this_00 = &test_info->result_;
  bVar1 = TestResult::Passed(this_00);
  if (bVar1) {
    fmt = "[       OK ] ";
  }
  else {
    bVar1 = TestResult::Skipped(this_00);
    if (!bVar1) {
      fmt = "[  FAILED  ] ";
      color = COLOR_RED;
      goto LAB_00152814;
    }
    fmt = "[  SKIPPED ] ";
  }
  color = COLOR_GREEN;
LAB_00152814:
  ColoredPrintf(color,fmt);
  PrintTestName((test_info->test_suite_name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p);
  bVar1 = TestResult::Failed(this_00);
  if (bVar1) {
    PrintFullTestCommentIfPresent(test_info);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_38 = (test_info->result_).elapsed_time_;
    StreamableToString<long_long>(&local_30,&local_38);
    printf(" (%s ms)\n",local_30._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
  }
  else {
    putchar(10);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(COLOR_GREEN, "[       OK ] ");
  } else if (test_info.result()->Skipped()) {
    ColoredPrintf(COLOR_GREEN, "[  SKIPPED ] ");
  } else {
    ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
  }
  PrintTestName(test_info.test_suite_name(), test_info.name());
  if (test_info.result()->Failed())
    PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms)\n", internal::StreamableToString(
           test_info.result()->elapsed_time()).c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}